

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

void uv__metrics_set_provider_entry_time(uv_loop_t *loop)

{
  uv_mutex_t *mutex;
  void *pvVar1;
  uint64_t uVar2;
  
  if ((*loop->internal_fields & 1) == 0) {
    return;
  }
  uVar2 = uv_hrtime();
  pvVar1 = loop->internal_fields;
  mutex = (uv_mutex_t *)((long)pvVar1 + 0x18);
  uv_mutex_lock(mutex);
  *(uint64_t *)((long)pvVar1 + 8) = uVar2;
  uv_mutex_unlock(mutex);
  return;
}

Assistant:

void uv__metrics_set_provider_entry_time(uv_loop_t* loop) {
  uv__loop_metrics_t* loop_metrics;
  uint64_t now;

  if (!(uv__get_internal_fields(loop)->flags & UV_METRICS_IDLE_TIME))
    return;

  now = uv_hrtime();
  loop_metrics = uv__get_loop_metrics(loop);
  uv_mutex_lock(&loop_metrics->lock);
  loop_metrics->provider_entry_time = now;
  uv_mutex_unlock(&loop_metrics->lock);
}